

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O2

double beta(double a,double b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if ((0.0 <= a) && (0.0 <= b)) {
    dVar1 = gamma_log(a);
    dVar2 = gamma_log(b);
    dVar3 = gamma_log(a + b);
    dVar1 = exp((dVar2 + dVar1) - dVar3);
    return dVar1;
  }
  printf(" The Two Inputs should be nonnegative and real");
  exit(1);
}

Assistant:

double beta(double a, double b) {
	double oup;
	if (a < 0. || b < 0.) {
		printf(" The Two Inputs should be nonnegative and real");
		exit(1);
	}
	oup = exp(gamma_log(a) + gamma_log(b) - gamma_log(a+b)); 
	return oup;
}